

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::TeamCityReporter::testCaseStarting(TeamCityReporter *this,TestCaseInfo *testInfo)

{
  uint64_t uVar1;
  ostream *poVar2;
  undefined1 in_stack_00000008 [16];
  string asStack_38 [32];
  
  uVar1 = std::chrono::_V2::system_clock::now();
  (this->m_testTimer).m_nanoseconds = uVar1;
  (this->super_StreamingReporterBase).currentTestCaseInfo = testInfo;
  poVar2 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                           "##teamcity[testStarted name=\'");
  (anonymous_namespace)::escape_abi_cxx11_((StringRef)in_stack_00000008);
  poVar2 = std::operator<<(poVar2,asStack_38);
  std::operator<<(poVar2,"\']\n");
  std::__cxx11::string::~string(asStack_38);
  std::ostream::flush();
  return;
}

Assistant:

void TeamCityReporter::testCaseStarting(TestCaseInfo const& testInfo) {
        m_testTimer.start();
        StreamingReporterBase::testCaseStarting(testInfo);
        m_stream << "##teamcity[testStarted name='"
            << escape(testInfo.name) << "']\n";
        m_stream.flush();
    }